

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O2

string * duckdb::StringUtil::Repeat(string *__return_storage_ptr__,string *str,idx_t n)

{
  bool bVar1;
  ostringstream os;
  ostringstream aoStack_198 [376];
  
  ::std::__cxx11::ostringstream::ostringstream(aoStack_198);
  while (bVar1 = n != 0, n = n - 1, bVar1) {
    ::std::operator<<((ostream *)aoStack_198,(string *)str);
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::ostringstream::~ostringstream(aoStack_198);
  return __return_storage_ptr__;
}

Assistant:

string StringUtil::Repeat(const string &str, idx_t n) {
	std::ostringstream os;
	for (idx_t i = 0; i < n; i++) {
		os << str;
	}
	return (os.str());
}